

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void fftCosInit(long M,float *Utbl)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ushort uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 in_ZMM0 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar36 [64];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar37 [64];
  undefined8 extraout_XMM0_Qb_05;
  undefined1 auVar38 [64];
  undefined1 extraout_var_06 [56];
  undefined1 local_1f8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [16];
  undefined1 local_168 [16];
  undefined1 auStack_158 [16];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  *Utbl = 1.0;
  uVar19 = 1L << (M & 0x3fU);
  uVar21 = uVar19 >> 2;
  if (2 < (ulong)M) {
    auVar23 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,uVar19);
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x100f0e0d0c0b0a09));
    uVar19 = 2;
    if (2 < uVar21) {
      uVar19 = uVar21;
    }
    uVar20 = 0;
    auVar28 = vpbroadcastq_avx512f();
    auVar28 = vmovdqu64_avx512f(auVar28);
    auVar23._0_8_ = 1.0 / auVar23._0_8_;
    auVar23._8_8_ = 0x3ff0000000000000;
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar30 = vbroadcastsd_avx512f(auVar23);
    do {
      auVar31 = vpbroadcastq_avx512f();
      auVar32 = vporq_avx512f(auVar31,_DAT_00109180);
      auVar33 = vmovdqu64_avx512f(auVar28);
      auVar34 = vporq_avx512f(auVar31,_DAT_001091c0);
      auVar29 = vmovdqu64_avx512f(auVar29);
      auVar31 = vmovdqu64_avx512f(auVar27);
      auVar35 = vcvtuqq2pd_avx512dq(auVar29);
      uVar16 = vpcmpuq_avx512f(auVar34,auVar33,2);
      auVar27 = vcvtuqq2pd_avx512dq(auVar27);
      auVar34 = vbroadcastsd_avx512f(ZEXT816(0x401921fb54442d18));
      uVar17 = vpcmpuq_avx512f(auVar32,auVar33,2);
      bVar18 = (byte)uVar17;
      uVar22 = CONCAT11(bVar18,(byte)uVar16);
      auVar27 = vmulpd_avx512f(auVar27,auVar30);
      auVar32 = vmulpd_avx512f(auVar35,auVar30);
      auVar27 = vmulpd_avx512f(auVar27,auVar34);
      auVar32 = vmulpd_avx512f(auVar32,auVar34);
      auVar23 = vextractf32x4_avx512f(auVar27,3);
      local_1c8._0_8_ = cos(auVar23._0_8_);
      local_1c8._8_8_ = extraout_XMM0_Qb;
      auVar23 = vpermilpd_avx(auVar23,1);
      auVar33._0_8_ = cos(auVar23._0_8_);
      auVar33._8_56_ = extraout_var;
      local_1c8._16_16_ = vunpcklpd_avx(local_1c8._0_16_,auVar33._0_16_);
      auVar24 = vextractf32x4_avx512f(auVar27,2);
      local_1f8._0_8_ = cos(auVar24._0_8_);
      local_1f8._8_8_ = extraout_XMM0_Qb_00;
      auVar23 = vpermilpd_avx(auVar24,1);
      auVar34._0_8_ = cos(auVar23._0_8_);
      auVar34._8_56_ = extraout_var_00;
      vunpcklpd_avx(local_1f8,auVar34._0_16_);
      auStack_198._0_8_ = auVar27._16_8_;
      uVar17 = auStack_198._0_8_;
      auStack_198 = auVar27._16_16_;
      local_1c8._0_16_ = auStack_198;
      local_1f8._0_8_ = cos((double)uVar17);
      local_1f8._8_8_ = extraout_XMM0_Qb_01;
      auVar23 = vpermilpd_avx(auVar24,1);
      auVar35._0_8_ = cos(auVar23._0_8_);
      auVar35._8_56_ = extraout_var_01;
      auVar23 = vunpcklpd_avx(local_1f8,auVar35._0_16_);
      local_1a8._0_8_ = auVar27._0_8_;
      local_1d8._0_8_ = cos((double)local_1a8._0_8_);
      local_1d8._8_8_ = extraout_XMM0_Qb_02;
      local_1a8 = auVar27._0_16_;
      auVar24 = vpermilpd_avx(local_1a8,1);
      auVar27._0_8_ = cos(auVar24._0_8_);
      auVar27._8_56_ = extraout_var_02;
      auVar24 = vunpcklpd_avx(local_1d8,auVar27._0_16_);
      auVar27 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar23,auVar24)),local_1c8,1);
      auVar23 = vextractf32x4_avx512f(auVar32,3);
      local_1c8._0_8_ = cos(auVar23._0_8_);
      local_1c8._8_8_ = extraout_XMM0_Qb_03;
      auVar23 = vpermilpd_avx(auVar23,1);
      auVar36._0_8_ = cos(auVar23._0_8_);
      auVar36._8_56_ = extraout_var_03;
      local_1c8._16_16_ = vunpcklpd_avx(local_1c8._0_16_,auVar36._0_16_);
      auVar24 = vextractf32x4_avx512f(auVar32,2);
      local_1f8._0_8_ = cos(auVar24._0_8_);
      local_1f8._8_8_ = extraout_XMM0_Qb_04;
      auVar23 = vpermilpd_avx(auVar24,1);
      auVar37._0_8_ = cos(auVar23._0_8_);
      auVar37._8_56_ = extraout_var_04;
      vunpcklpd_avx(local_1f8,auVar37._0_16_);
      auStack_158._0_8_ = auVar32._16_8_;
      uVar17 = auStack_158._0_8_;
      auStack_158 = auVar32._16_16_;
      local_1c8._0_16_ = auStack_158;
      local_1f8._0_8_ = cos((double)uVar17);
      local_1f8._8_8_ = extraout_XMM0_Qb_05;
      auVar23 = vpermilpd_avx(auVar24,1);
      auVar38._0_8_ = cos(auVar23._0_8_);
      auVar38._8_56_ = extraout_var_05;
      auVar23 = vunpcklpd_avx(local_1f8,auVar38._0_16_);
      local_168._0_8_ = auVar32._0_8_;
      local_1d8._0_8_ = cos((double)local_168._0_8_);
      local_1d8._8_8_ = extraout_XMM0_Qb_06;
      local_168 = auVar32._0_16_;
      auVar24 = vpermilpd_avx(local_168,1);
      auVar32._0_8_ = cos(auVar24._0_8_);
      auVar32._8_56_ = extraout_var_06;
      auVar29 = vmovdqu64_avx512f(auVar29);
      auVar31 = vmovdqu64_avx512f(auVar31);
      auVar24 = vunpcklpd_avx(local_1d8,auVar32._0_16_);
      auVar25 = vcvtpd2ps_avx512f(auVar27);
      auVar27 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar23,auVar24)),local_1c8,1);
      auVar26 = vcvtpd2ps_avx512f(auVar27);
      auVar27 = vinsertf64x4_avx512f(ZEXT3264(auVar26),auVar25,1);
      auVar32 = vpbroadcastq_avx512f(ZEXT816(0x10));
      pfVar1 = Utbl + uVar20 + 1;
      bVar2 = (bool)((byte)uVar16 & 1);
      bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar22 >> 7) & 1);
      bVar10 = (bool)(bVar18 >> 1 & 1);
      bVar11 = (bool)(bVar18 >> 2 & 1);
      bVar12 = (bool)(bVar18 >> 3 & 1);
      bVar13 = (bool)(bVar18 >> 4 & 1);
      bVar14 = (bool)(bVar18 >> 5 & 1);
      bVar15 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)bVar2 * auVar27._0_4_ | (uint)!bVar2 * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar5 * auVar27._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar6 * auVar27._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar7 * auVar27._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar8 * auVar27._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar9 * auVar27._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar27._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar10 * auVar27._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar11 * auVar27._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar12 * auVar27._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar13 * auVar27._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar14 * auVar27._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar15 * auVar27._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar27._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar20 = uVar20 + 0x10;
      auVar29 = vpaddq_avx512f(auVar29,auVar32);
      auVar27 = vpaddq_avx512f(auVar31,auVar32);
    } while ((uVar19 + 0xe & 0xfffffffffffffff0) != uVar20);
  }
  Utbl[uVar21] = 0.0;
  return;
}

Assistant:

void fftCosInit(long M, float *Utbl){
/* Compute Utbl, the cosine table for ffts	*/
/* of size (pow(2,M)/4 +1)	*/
/* INPUTS */
/* M = log2 of fft size	*/
/* OUTPUTS */
/* *Utbl = cosine table	*/
unsigned long fftN = POW2(M);
unsigned long i1;
	Utbl[0] = 1.0;
	for (i1 = 1; i1 < fftN/4; i1++)
		Utbl[i1] = cos( (2.0 * MYPI * i1) / fftN );
	Utbl[fftN/4] = 0.0;
}